

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void container_suite::test_set_one(void)

{
  size_t *this;
  undefined4 local_120;
  key_type local_11c;
  size_type local_118;
  undefined4 local_10c;
  size_type local_108 [3];
  char *msg;
  undefined1 local_e0 [8];
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> value;
  iarchive in;
  value_type input [6];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0x9193;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0x12829290;
  this = &value.data._M_t._M_impl.super__Rb_tree_header._M_node_count;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>
            ((iarchive *)this,
             (uchar (*) [6])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_>::type_struct
            ((type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_e0);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)this,
             (type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_e0);
  local_108[0] = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_e0);
  local_10c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x332,"void container_suite::test_set_one()",local_108,&local_10c);
  local_11c = 0x12;
  local_118 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_e0,&local_11c);
  local_120 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.data.count(0x12)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x333,"void container_suite::test_set_one()",&local_118,&local_120);
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~type_struct
            ((type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_e0);
  trial::protocol::bintoken::iarchive::~iarchive
            ((iarchive *)&value.data._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void test_set_one()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::begin_array,
                                 token::code::null,
                                 0x12,
                                 token::code::end_array,
                                 token::code::end_record };
    format::iarchive in(input);
    type_struct< std::set<int> > value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.data.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value.data.count(0x12), 1);
}